

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int matchbracketclass(int c,char *p,char *ec)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  bool bVar6;
  bool bVar7;
  
  bVar7 = p[1] == '^';
  bVar2 = !bVar7;
  pbVar4 = (byte *)(p + 1);
  if (!bVar7) {
    pbVar4 = (byte *)p;
  }
  do {
    while( true ) {
      bVar6 = bVar7;
      if (ec <= pbVar4 + 1) goto LAB_0010cab3;
      bVar1 = pbVar4[1];
      bVar6 = bVar2;
      if (bVar1 == 0x25) break;
      if ((pbVar4[2] == 0x2d) && (pbVar5 = pbVar4 + 3, pbVar5 < ec)) {
        pbVar4 = pbVar5;
        if (((int)(uint)bVar1 <= c) && ((uint)c <= (uint)*pbVar5)) goto LAB_0010cab3;
      }
      else {
        pbVar4 = pbVar4 + 1;
        if ((uint)bVar1 == c) goto LAB_0010cab3;
      }
    }
    iVar3 = match_class(c,(uint)pbVar4[2]);
    pbVar4 = pbVar4 + 2;
  } while (iVar3 == 0);
LAB_0010cab3:
  return (int)bVar6;
}

Assistant:

static int matchbracketclass(int c, const char *p, const char *ec)
{
  int sig = 1;
  if (*(p+1) == '^') {
    sig = 0;
    p++;  /* skip the `^' */
  }
  while (++p < ec) {
    if (*p == L_ESC) {
      p++;
      if (match_class(c, uchar(*p)))
	return sig;
    }
    else if ((*(p+1) == '-') && (p+2 < ec)) {
      p+=2;
      if (uchar(*(p-2)) <= c && c <= uchar(*p))
	return sig;
    }
    else if (uchar(*p) == c) return sig;
  }
  return !sig;
}